

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLocalDecl
          (BinaryReaderIR *this,Index decl_index,Index count,Type type)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Module *pMVar3;
  Index IVar4;
  Index local_1c;
  Type local_18;
  
  local_1c = count;
  local_18 = type;
  if (count != 0) {
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)&this->current_func_->local_types,&local_18,&local_1c);
  }
  IVar4 = LocalTypes::size(&this->current_func_->local_types);
  if (IVar4 < 0xc351) {
    pMVar3 = this->module_;
    paVar1 = &pMVar3->features_used;
    paVar1->simd = (bool)(paVar1->simd | type.enum_ == V128);
    pbVar2 = &(pMVar3->features_used).exceptions;
    *pbVar2 = (bool)(*pbVar2 | type.enum_ == ExnRef);
  }
  else {
    PrintError(this,"function local count exceeds maximum value");
  }
  return (Result)(uint)(IVar4 >= 0xc351);
}

Assistant:

Result BinaryReaderIR::OnLocalDecl(Index decl_index, Index count, Type type) {
  current_func_->local_types.AppendDecl(type, count);

  if (current_func_->GetNumLocals() > kMaxFunctionLocals) {
    PrintError("function local count exceeds maximum value");
    return Result::Error;
  }

  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}